

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  string local_60;
  string local_30 [8];
  string InputLine;
  
  InputLine.field_2._12_4_ = 0;
  std::__cxx11::string::string(local_30);
  while( true ) {
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&std::cin + *(long *)(std::cin + -0x18)));
    if (!bVar1) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
    std::__cxx11::string::string((string *)&local_60,local_30);
    handleLine(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string(local_30);
  return InputLine.field_2._12_4_;
}

Assistant:

int main() {
  std::string InputLine;
  while (std::cin) {
    getline(std::cin, InputLine);
    handleLine(InputLine);
  };
}